

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<lsh::vector_const&>::
captureExpression<(Catch::Internal::Operator)1,lsh::vector>
          (ExpressionLhs<lsh::vector_const&> *this,vector *rhs)

{
  ResultBuilder *pRVar1;
  bool bVar2;
  OfType OVar3;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pRVar1 = *(ResultBuilder **)this;
  bVar2 = lsh::vector::operator!=(*(vector **)(this + 8),rhs);
  OVar3 = ExpressionFailed;
  if (bVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,Detail::unprintableString_abi_cxx11_,
             DAT_0014c4e0 + Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,Detail::unprintableString_abi_cxx11_,
             DAT_0014c4e0 + Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"!=","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }